

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
abstract_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  element_type *peVar1;
  Value *in_RDI;
  
  Value::Value(in_RDI);
  in_RDI->_vptr_Value = (_func_int **)&PTR__abstract_value_001a5468;
  std::make_shared<std::__cxx11::string>();
  peVar1 = std::
           __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ::get((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(in_RDI + 1));
  in_RDI[1].super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
  *(undefined1 *)&in_RDI[2]._vptr_Value = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_Value + 1) = 0;
  std::__cxx11::string::string((string *)&in_RDI[2].super_enable_shared_from_this<cxxopts::Value>);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[3].super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
              super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

abstract_value()
      : m_result(std::make_shared<T>())
      , m_store(m_result.get())
      {
      }